

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

size_t __thiscall
tsbp::TwoStepBranchingProcedure::UpdatePlacedAreaAndDetermineLoss
          (TwoStepBranchingProcedure *this,PackingRelaxed2D *packing,Rectangle *item)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  
  uVar8 = packing->MinX;
  iVar1 = item->Dx;
  uVar7 = uVar8 + (long)iVar1;
  if (uVar8 < uVar7) {
    puVar5 = (packing->PlacedAreaVector).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = item->Dy;
    iVar3 = (this->container).super_Rectangle.Dy;
    uVar9 = puVar5[uVar8];
    iVar10 = iVar3 - (int)uVar9;
    if (uVar9 + (long)iVar2 <=
        (ulong)((long)iVar3 - (long)packing->MinimumRemainingItemDyAtCurrentX)) {
      iVar10 = iVar2;
    }
    iVar4 = packing->MinimumRemainingItemDy;
    dVar11 = packing->DeactivatedArea;
    do {
      uVar6 = puVar5[uVar8];
      if (uVar6 < uVar9) {
        packing->MinimumRemainingItemDyAtCurrentX = iVar4;
        if ((ulong)(long)(iVar3 - iVar4) < uVar6 + (long)iVar2) {
          uVar9 = uVar6;
          iVar10 = iVar3 - (int)uVar6;
        }
        else {
          uVar9 = 0;
          uVar7 = uVar8;
          iVar10 = iVar2;
        }
      }
      dVar11 = dVar11 + (double)iVar10;
      puVar5[uVar8] = uVar6 + (long)iVar10;
      uVar8 = uVar8 + 1;
    } while (uVar8 < packing->MinX + (long)iVar1);
    packing->DeactivatedArea = dVar11;
  }
  return uVar7;
}

Assistant:

size_t TwoStepBranchingProcedure::UpdatePlacedAreaAndDetermineLoss(PackingRelaxed2D& packing, const Rectangle& item)
{
    // This lower bound can be raised by determining the remaining minY at newX at a cost of O(n) or by solving a subset sum problem; cf. SS_1 in [CJCM2008] section 5.2.
    // Instead, what we do here is to see if there exists any item at current x that can be placed, which was already determined in IsPlacementFeasible().
    // If none can be placed, no SSP must be solved. The space between the item and the container can be marked as lost by deactivating the area.
    // By solving SSPs, infeasibility by detected lost space might be detected earlier during search and save a lot of child nodes. When SSPs are solved, there should be a
    // condition for when to solve them to not unnecessarily expend time. For example, it would make sense to only do so if the used area plus remaining area of items to place is
    // close to the container area.
    // TODO.Performance: subset sum can be solved faster than classically in O(nC), where n is the number of items and C is the (remaining) capacity/height at at current x,
    // namely in O(n max Z), \tilde{O}(sqrt(n)C), \tilde{O}(n + C); cp. https://arxiv.org/abs/1610.04712.
    // Further references:
    // - https://en.wikipedia.org/wiki/Subset_sum_problem#Pseudo-polynomial_time_dynamic_programming_solutions
    // - https://en.wikipedia.org/wiki/Subset_sum_problem#Polynomial_time_approximate_algorithm
    // - For the \tilde{O}(sqrt(n)C) algorithm and a good comparison of algorithms, see https://arxiv.org/pdf/1507.02318v1.pdf and table 1.1 therein. A Java implementation is available: https://github.com/shtratos/subsetsum.
    // - For the \tilde{O}(n + C) algorithm, see https://arxiv.org/abs/1610.04712 (the error term means that is is not guaranteed to be exact?).
    //   It also states that "Using number-theoretic arguments, certain dense cases of SubsetSum are solvable in near-linear time, e.g., if t << n^2 then there is an \tilde{O}(n) algorithm [11]",
    //   and t << n^2 might be satisfied in our case.
    // - The complexities stated in the more recent paper https://arxiv.org/abs/1610.04712 use a tilde above big O, which means that logarithmic factors are ignored, see https://www.johndcook.com/blog/2019/01/17/big-o-tilde-notation/.
    //   Here, we deal mostly with small instances of SSPs, so ignored logarithmic factors should be accounted for as it might have a disproportionate impact for small n or a considerable tradeoff in space complexity.
    // Probably just go for the classical O(nC).
    int deactivatedDy = packing.PlacedAreaVector[packing.MinX] + item.Dy > container.Dy - packing.MinimumRemainingItemDyAtCurrentX
                            ? container.Dy - packing.PlacedAreaVector[packing.MinX]
                            : item.Dy;

    size_t newX = packing.MinX + item.Dx;
    size_t lastY = packing.PlacedAreaVector[packing.MinX];
    for (size_t x = packing.MinX; x < packing.MinX + item.Dx; x++)
    {
        size_t currentY = packing.PlacedAreaVector[x];

        if (currentY < lastY)
        {
            // K(x) is non-increasing, so the first occurence where currentY < lastY is the next placement position.
            // When currentY < lastY corresponds to the values that the function \roh(Z) in [CJCM2008] returns: "the set of coordinates Z_1 at which the value H_x moves".

            // Mus be reset because the next placement point x > packing.MinX.
            // This lower bound (MinimumRemainingItemDy) can be raised by determining the remaining minY at newX at a cost of O(n) or by solving a subset sum problem.
            // The latter would yield SS_1 of [CJCM2008] if it was performed for [packing.MinX, container.Dx] instead of only [packing.MinX, packing.MinX + item.Dx].
            packing.MinimumRemainingItemDyAtCurrentX = packing.MinimumRemainingItemDy;

            if (packing.PlacedAreaVector[x] + item.Dy > container.Dy - packing.MinimumRemainingItemDyAtCurrentX)
            {
                lastY = currentY;
                deactivatedDy = container.Dy - packing.PlacedAreaVector[x];
            }
            else
            {
                // We set lastY to zero to be able to complete the loop but not re-enter this branch, in order to correctly update DeactivatedArea and PlacedAreaVector.
                newX = x;
                lastY = 0;
                deactivatedDy = item.Dy;
            }
        }

        packing.DeactivatedArea += deactivatedDy;
        packing.PlacedAreaVector[x] += deactivatedDy;
    }

    return newX;
}